

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::EvaluateSectionDisplacement
          (ChElementBeamTaperedTimoshenko *this,double eta,ChVector<double> *u_displ,
          ChVector<double> *u_rotaz)

{
  undefined1 auVar1 [32];
  int iVar2;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *pCVar3;
  char *__function;
  double dVar4;
  double dVar7;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChVectorDynamic<> displ;
  ChVectorN<double,_4> qez;
  ChVectorN<double,_2> qerx;
  ChVectorN<double,_2> qeux;
  ChVectorN<double,_4> qey;
  ShapeFunctionGroup NN;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_5f0;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_5e0;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_5c0;
  double local_5a0;
  double dStack_598;
  double dStack_590;
  double dStack_588;
  double local_570;
  double dStack_568;
  undefined1 local_560 [24];
  double dStack_548;
  double local_540;
  double dStack_538;
  double dStack_530;
  double dStack_528;
  double local_520;
  double dStack_518;
  double dStack_510;
  double dStack_508;
  double local_500;
  double dStack_4f8;
  double dStack_4f0;
  double dStack_4e8;
  double local_4e0;
  double dStack_4d8;
  double dStack_4d0;
  double dStack_4c8;
  double local_4c0;
  double dStack_4b8;
  double dStack_4b0;
  double dStack_4a8;
  Matrix<double,_4,_1,_0,_4,_1> local_4a0;
  ShapeFunctionGroup local_480;
  
  local_5a0 = eta;
  iVar2 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])();
  local_5f0.m_storage.m_data = (double *)0x0;
  local_5f0.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_5f0,(long)iVar2);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
            (this,&local_5f0);
  ShapeFunctionsTimoshenko(this,&local_480,local_5a0);
  if (local_5f0.m_storage.m_rows < 2) {
LAB_0067341a:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  local_5c0.m_xpr = &local_4a0;
  local_5c0.m_row = 0;
  local_5c0.m_col = 1;
  local_5c0.m_currentBlockRows = 1;
  local_4a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       local_5f0.m_storage.m_data[1];
  local_4e0 = local_480.
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
              ._M_head_impl.
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .
              super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .
              super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .
              super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
              super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0]
  ;
  dStack_4d8 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [1];
  dStack_4d0 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [2];
  dStack_4c8 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [3];
  local_500 = local_480.
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
              ._M_head_impl.
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .
              super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .
              super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
              super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0]
  ;
  dStack_4f8 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [1];
  dStack_4f0 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [2];
  dStack_4e8 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [3];
  local_570 = local_480.
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
              ._M_head_impl.
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .
              super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .
              super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .
              super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .super__Tuple_impl<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
              super__Head_base<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_false>._M_head_impl.
              super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0]
  ;
  dStack_568 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<3UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Tuple_impl<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
               super__Head_base<4UL,_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
               [1];
  local_520 = local_480.
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
              ._M_head_impl.
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .
              super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
              super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0]
  ;
  dStack_518 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [1];
  dStack_510 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [2];
  dStack_508 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [3];
  local_540 = local_480.
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
              ._M_head_impl.
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
              super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0]
  ;
  dStack_538 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [1];
  dStack_530 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [2];
  dStack_528 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [3];
  local_4c0 = local_480.
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
              ._M_head_impl.
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .
              super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .
              super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
              super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0]
  ;
  dStack_4b8 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [1];
  dStack_4b0 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [2];
  dStack_4a8 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<1UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .
               super__Tuple_impl<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<2UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [3];
  local_5a0 = local_480.
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
              .
              super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
              ._M_head_impl.
              super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
              .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
              super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array[0]
  ;
  dStack_598 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [1];
  dStack_590 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [2];
  dStack_588 = local_480.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<1UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Tuple_impl<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
               .
               super__Head_base<2UL,_std::tuple<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>,_false>
               ._M_head_impl.
               super__Tuple_impl<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
               .super__Head_base<0UL,_Eigen::Matrix<double,_1,_4,_1,_1,_4>,_false>._M_head_impl.
               super_PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>.m_storage.m_data.array
               [3];
  if ((ulong)local_5f0.m_storage.m_rows < 6) goto LAB_0067341a;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                     (&local_5c0,local_5f0.m_storage.m_data + 5);
  if ((local_5f0.m_storage.m_rows < 8) ||
     (pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                         (pCVar3,local_5f0.m_storage.m_data + 7), local_5f0.m_storage.m_rows < 0xc))
  goto LAB_0067341a;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (pCVar3,local_5f0.m_storage.m_data + 0xb);
  if ((local_5c0.m_currentBlockRows + local_5c0.m_row == 4) &&
     ((double)local_5c0.m_col == 4.94065645841247e-324)) {
    if (local_5f0.m_storage.m_rows < 3) goto LAB_0067341a;
    local_5e0.m_row = 0;
    local_5e0.m_col = 1;
    local_5e0.m_currentBlockRows = 1;
    local_5c0.m_xpr = (Matrix<double,_4,_1,_0,_4,_1> *)local_5f0.m_storage.m_data[2];
    local_5e0.m_xpr = (Matrix<double,_4,_1,_0,_4,_1> *)&local_5c0;
    if ((((ulong)local_5f0.m_storage.m_rows < 5) ||
        (pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                            (&local_5e0,local_5f0.m_storage.m_data + 4),
        local_5f0.m_storage.m_rows < 9)) ||
       (pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                           (pCVar3,local_5f0.m_storage.m_data + 8), local_5f0.m_storage.m_rows < 0xb
       )) goto LAB_0067341a;
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
              (pCVar3,local_5f0.m_storage.m_data + 10);
    if ((local_5e0.m_currentBlockRows + local_5e0.m_row == 4) && (local_5e0.m_col == 1)) {
      if (local_5f0.m_storage.m_rows < 1) goto LAB_0067341a;
      local_5e0.m_xpr = (Matrix<double,_4,_1,_0,_4,_1> *)(local_560 + 0x10);
      local_5e0.m_row = 0;
      local_5e0.m_col = 1;
      local_5e0.m_currentBlockRows = 1;
      local_560._16_8_ = *local_5f0.m_storage.m_data;
      if ((ulong)local_5f0.m_storage.m_rows < 7) goto LAB_0067341a;
      Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_5e0,
                 local_5f0.m_storage.m_data + 6);
      if ((local_5e0.m_currentBlockRows + local_5e0.m_row == 2) && (local_5e0.m_col == 1)) {
        if (local_5f0.m_storage.m_rows < 4) goto LAB_0067341a;
        local_5e0.m_xpr = (Matrix<double,_4,_1,_0,_4,_1> *)local_560;
        local_5e0.m_row = 0;
        local_5e0.m_col = 1;
        local_5e0.m_currentBlockRows = 1;
        local_560._0_8_ = local_5f0.m_storage.m_data[3];
        if ((ulong)local_5f0.m_storage.m_rows < 10) goto LAB_0067341a;
        Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                  ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_5e0,
                   local_5f0.m_storage.m_data + 9);
        if ((local_5e0.m_currentBlockRows + local_5e0.m_row == 2) && (local_5e0.m_col == 1)) {
          u_displ->m_data[0] = local_570 * (double)local_560._16_8_ + dStack_568 * dStack_548;
          u_displ->m_data[1] =
               (local_540 + local_520) *
               local_4a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
               m_data.array[0] +
               (dStack_530 + dStack_510) *
               local_4a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
               m_data.array[2] +
               (dStack_538 + dStack_518) *
               local_4a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
               m_data.array[1] +
               (dStack_528 + dStack_508) *
               local_4a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
               m_data.array[3];
          dVar4 = (local_500 + local_4e0) * (double)local_5c0.m_xpr +
                  (dStack_4f0 + dStack_4d0) * (double)local_5c0.m_col;
          dVar7 = (dStack_4f8 + dStack_4d8) * (double)local_5c0.m_row +
                  (dStack_4e8 + dStack_4c8) * (double)local_5c0.m_currentBlockRows;
          auVar1._8_8_ = dStack_4b8;
          auVar1._0_8_ = local_4c0;
          auVar1._16_8_ = dStack_4b0;
          auVar1._24_8_ = dStack_4a8;
          auVar1 = vsubpd_avx(ZEXT832(0) << 0x40,auVar1);
          auVar5._0_8_ = dVar4 + dVar7;
          auVar5._8_8_ = dVar4 + dVar7;
          dVar4 = (double)vmovlpd_avx(auVar5);
          u_displ->m_data[2] = dVar4;
          u_rotaz->m_data[0] =
               local_570 * (double)local_560._0_8_ + dStack_568 * (double)local_560._8_8_;
          u_rotaz->m_data[1] =
               auVar1._0_8_ * (double)local_5c0.m_xpr + auVar1._16_8_ * (double)local_5c0.m_col +
               auVar1._8_8_ * (double)local_5c0.m_row +
               auVar1._24_8_ * (double)local_5c0.m_currentBlockRows;
          dVar4 = local_4a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array[0] * local_5a0 +
                  local_4a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array[2] * dStack_590;
          dVar7 = local_4a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array[1] * dStack_598 +
                  local_4a0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                  m_data.array[3] * dStack_588;
          auVar6._0_8_ = dVar4 + dVar7;
          auVar6._8_8_ = dVar4 + dVar7;
          dVar4 = (double)vmovlpd_avx(auVar6);
          u_rotaz->m_data[2] = dVar4;
          if (local_5f0.m_storage.m_data != (double *)0x0) {
            free((void *)local_5f0.m_storage.m_data[-1]);
          }
          return;
        }
      }
      __function = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 1>>::finished() [MatrixType = Eigen::Matrix<double, 2, 1>]"
      ;
      goto LAB_00673468;
    }
  }
  __function = 
  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 1>>::finished() [MatrixType = Eigen::Matrix<double, 4, 1>]"
  ;
LAB_00673468:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

void ChElementBeamTaperedTimoshenko::EvaluateSectionDisplacement(const double eta,
                                                                 ChVector<>& u_displ,
                                                                 ChVector<>& u_rotaz) {
    ChVectorDynamic<> displ(this->GetNdofs());
    this->GetStateBlock(displ);
    // No transformation for the displacement of two nodes,
    // so the section displacement is evaluated at the centerline of beam

    ShapeFunctionGroup NN;
    ShapeFunctionsTimoshenko(NN, eta);
    ShapeFunction5Blocks sfblk = std::get<1>(NN);
    ShapeFunction5Blocks sfblk1d = std::get<2>(NN);
    auto kNby = std::get<0>(sfblk);
    auto kNsy = std::get<1>(sfblk);
    auto kNbz = std::get<2>(sfblk);
    auto kNsz = std::get<3>(sfblk);
    auto kNx = std::get<4>(sfblk);
    auto dkNby = std::get<0>(sfblk1d);
    auto dkNbz = std::get<2>(sfblk1d);

    ChVectorN<double, 4> qey;
    qey << displ(1), displ(5), displ(7), displ(11);
    ChVectorN<double, 4> qez;
    qez << displ(2), displ(4), displ(8), displ(10);
    ChVectorN<double, 2> qeux;
    qeux << displ(0), displ(6);
    ChVectorN<double, 2> qerx;
    qerx << displ(3), displ(9);

    u_displ.x() = kNx * qeux;
    u_displ.y() = (kNby + kNsy) * qey;
    u_displ.z() = (kNbz + kNsz) * qez;
    u_rotaz.x() = kNx * qerx;
    u_rotaz.y() = -dkNbz * qez;
    u_rotaz.z() = dkNby * qey;
}